

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O1

void __thiscall
slang::ast::CaseStatement::serializeTo(CaseStatement *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  size_t sVar3;
  pointer pIVar4;
  long lVar5;
  ItemGroup *item;
  pointer pIVar6;
  string_view name;
  string_view name_00;
  
  sVar3 = strlen(*(char **)(toString(slang::ast::CaseStatementCondition)::strings +
                           (long)(int)this->condition * 8));
  ASTSerializer::write(serializer,9,"condition",sVar3);
  sVar3 = strlen(*(char **)(toString(slang::ast::UniquePriorityCheck)::strings +
                           (long)(int)this->check * 8));
  ASTSerializer::write(serializer,5,"check",sVar3);
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar6 = (this->items)._M_ptr;
    pIVar4 = pIVar6 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      name_00._M_str = "expressions";
      name_00._M_len = 0xb;
      ASTSerializer::startArray(serializer,name_00);
      sVar1 = (pIVar6->expressions)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppEVar2 = (pIVar6->expressions)._M_ptr;
        lVar5 = 0;
        do {
          ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar5));
          lVar5 = lVar5 + 8;
        } while (sVar1 << 3 != lVar5);
      }
      ASTSerializer::endArray(serializer);
      ASTSerializer::write(serializer,4,"stmt",(size_t)(pIVar6->stmt).ptr);
      ASTSerializer::endObject(serializer);
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar4);
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (Statement *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void CaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions) {
            serializer.serialize(*ex);
        }
        serializer.endArray();

        serializer.write("stmt", *item.stmt);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}